

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStreamComponent_EndPolling
                  (PaAlsaStreamComponent *self,pollfd *pfds,int *shouldPoll,int *xrun)

{
  int iVar1;
  int iVar2;
  pthread_t __thread1;
  char *errorText;
  ushort local_2e;
  int __pa_unsure_error_id;
  unsigned_short revents;
  int *piStack_28;
  PaError result;
  int *xrun_local;
  int *shouldPoll_local;
  pollfd *pfds_local;
  PaAlsaStreamComponent *self_local;
  
  __pa_unsure_error_id = 0;
  piStack_28 = xrun;
  xrun_local = shouldPoll;
  shouldPoll_local = &pfds->fd;
  pfds_local = (pollfd *)self;
  iVar1 = (*alsa_snd_pcm_poll_descriptors_revents)(self->pcm,pfds,self->nfds,&local_2e);
  if (iVar1 < 0) {
    __thread1 = pthread_self();
    iVar2 = pthread_equal(__thread1,paUnixMainThread);
    if (iVar2 != 0) {
      errorText = (*alsa_snd_strerror)(iVar1);
      PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,errorText);
    }
    PaUtil_DebugPrint(
                     "Expression \'alsa_snd_pcm_poll_descriptors_revents( self->pcm, pfds, self->nfds, &revents )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3654\n"
                     );
    __pa_unsure_error_id = -9999;
  }
  else if (local_2e == 0) {
    iVar1._0_2_ = pfds_local[6].events;
    iVar1._2_2_ = pfds_local[6].revents;
    if (iVar1 != 0) {
      pfds_local[0xb].fd = 1;
      *xrun_local = 0;
    }
  }
  else {
    if ((local_2e & 8) == 0) {
      if ((local_2e & 0x10) == 0) {
        pfds_local[0xb].fd = 1;
      }
      else {
        *piStack_28 = 1;
      }
    }
    else {
      *piStack_28 = 1;
    }
    *xrun_local = 0;
  }
  return __pa_unsure_error_id;
}

Assistant:

static PaError PaAlsaStreamComponent_EndPolling( PaAlsaStreamComponent* self, struct pollfd* pfds, int* shouldPoll, int* xrun )
{
    PaError result = paNoError;
    unsigned short revents;

    ENSURE_( alsa_snd_pcm_poll_descriptors_revents( self->pcm, pfds, self->nfds, &revents ), paUnanticipatedHostError );
    if( revents != 0 )
    {
        if( revents & POLLERR )
        {
            *xrun = 1;
        }
        else if( revents & POLLHUP )
        {
            *xrun = 1;
            PA_DEBUG(( "%s: revents has POLLHUP, processing as XRUN\n", __FUNCTION__ ));
        }
        else
            self->ready = 1;

        *shouldPoll = 0;
    }
    else /* (A zero revent occurred) */
        /* Work around an issue with Alsa older than 1.0.16 using some plugins (eg default with plug + dmix) where
         * POLLIN or POLLOUT are zeroed by Alsa-lib if _mmap_avail() is a few frames short of avail_min at period
         * boundary, possibly due to erratic dma interrupts at period boundary?  Treat as a valid event.
         */
        if( self->useReventFix )
        {
            self->ready = 1;
            *shouldPoll = 0;
        }

error:
    return result;
}